

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseSystemLiteral(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  uint val;
  int iVar3;
  xmlChar *pxVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int l;
  xmlChar *local_50;
  int local_44;
  xmlParserInputState local_40;
  int local_3c;
  uint local_38;
  int local_34;
  
  iVar7 = 10000000;
  if ((ctxt->options & 0x80000) == 0) {
    iVar7 = 50000;
  }
  local_40 = ctxt->instate;
  if (ctxt->progressive == 0) {
    pxVar2 = ctxt->input;
    if ((500 < (long)pxVar2->cur - (long)pxVar2->base) &&
       ((long)pxVar2->end - (long)pxVar2->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  bVar1 = *ctxt->input->cur;
  uVar6 = (uint)bVar1;
  if (bVar1 != 0x22) {
    if (bVar1 != 0x27) {
      xmlFatalErr(ctxt,XML_ERR_LITERAL_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    uVar6 = 0x27;
  }
  xmlNextChar(ctxt);
  local_50 = (xmlChar *)(*xmlMallocAtomic)(100);
  if (local_50 == (xmlChar *)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
  }
  else {
    ctxt->instate = XML_PARSER_SYSTEM_LITERAL;
    val = xmlCurrentChar(ctxt,&local_44);
    iVar9 = 0;
    iVar8 = 0;
    iVar3 = 100;
    local_3c = iVar7;
    local_38 = uVar6;
    do {
      if ((int)val < 0x100) {
        if ((((int)val < 0x20) && ((0xd < val || ((0x2600U >> (val & 0x1f) & 1) == 0)))) ||
           (val == uVar6)) goto LAB_0015a633;
      }
      else if ((val == uVar6) ||
              ((val - 0xfffe < 0xffffe002 && val - 0x110000 < 0xfff00000) && 0xd7ff < (int)val)) {
LAB_0015a633:
        local_50[iVar9] = '\0';
        ctxt->instate = local_40;
        if ((int)val < 0x100) {
          if (((int)val < 0x20) && ((0xd < val || ((0x2600U >> (val & 0x1f) & 1) == 0)))) {
LAB_0015a6a1:
            xmlFatalErr(ctxt,XML_ERR_LITERAL_NOT_FINISHED,(char *)0x0);
            return local_50;
          }
        }
        else if ((0xfffff < val - 0x10000 && 0x1ffd < val - 0xe000) && 0xd7ff < (int)val)
        goto LAB_0015a6a1;
        xmlNextChar(ctxt);
        return local_50;
      }
      pxVar4 = local_50;
      if (iVar3 <= iVar9 + 5) {
        iVar3 = iVar3 * 2;
        pxVar4 = (xmlChar *)(*xmlRealloc)(local_50,(long)iVar3);
        iVar7 = local_3c;
        uVar6 = local_38;
        if (pxVar4 == (xmlChar *)0x0) {
          (*xmlFree)(local_50);
          xmlErrMemory(ctxt,(char *)0x0);
          ctxt->instate = local_40;
          return (xmlChar *)0x0;
        }
      }
      local_34 = iVar3;
      if (iVar8 < 0x32) {
        iVar8 = iVar8 + 1;
      }
      else {
        if (ctxt->progressive == 0) {
          pxVar2 = ctxt->input;
          if ((500 < (long)pxVar2->cur - (long)pxVar2->base) &&
             ((long)pxVar2->end - (long)pxVar2->cur < 500)) {
            xmlSHRINK(ctxt);
          }
        }
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        iVar8 = 0;
        if (ctxt->instate == XML_PARSER_EOF) {
          (*xmlFree)(pxVar4);
          return (xmlChar *)0x0;
        }
      }
      if (local_44 == 1) {
        lVar5 = (long)iVar9;
        iVar9 = iVar9 + 1;
        pxVar4[lVar5] = (xmlChar)val;
      }
      else {
        iVar3 = xmlCopyCharMultiByte(pxVar4 + iVar9,val);
        iVar9 = iVar3 + iVar9;
      }
      pxVar2 = ctxt->input;
      if (*pxVar2->cur == '\n') {
        pxVar2->line = pxVar2->line + 1;
        pxVar2->col = 1;
      }
      else {
        pxVar2->col = pxVar2->col + 1;
      }
      pxVar2->cur = pxVar2->cur + local_44;
      val = xmlCurrentChar(ctxt,&local_44);
      if (val == 0) {
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        if (ctxt->progressive == 0) {
          pxVar2 = ctxt->input;
          if ((500 < (long)pxVar2->cur - (long)pxVar2->base) &&
             ((long)pxVar2->end - (long)pxVar2->cur < 500)) {
            xmlSHRINK(ctxt);
          }
        }
        val = xmlCurrentChar(ctxt,&local_44);
      }
      iVar3 = local_34;
      local_50 = pxVar4;
    } while (iVar9 <= iVar7);
    xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"SystemLiteral");
    (*xmlFree)(pxVar4);
    ctxt->instate = local_40;
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseSystemLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int cur, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;
    xmlChar stop;
    int state = ctxt->instate;
    int count = 0;

    SHRINK;
    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }

    buf = (xmlChar *) xmlMallocAtomic(size);
    if (buf == NULL) {
        xmlErrMemory(ctxt, NULL);
	return(NULL);
    }
    ctxt->instate = XML_PARSER_SYSTEM_LITERAL;
    cur = CUR_CHAR(l);
    while ((IS_CHAR(cur)) && (cur != stop)) { /* checked */
	if (len + 5 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size);
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt, NULL);
		ctxt->instate = (xmlParserInputState) state;
		return(NULL);
	    }
	    buf = tmp;
	}
	count++;
	if (count > 50) {
	    SHRINK;
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
	        xmlFree(buf);
		return(NULL);
            }
	}
	COPY_BUF(l,buf,len,cur);
	NEXTL(l);
	cur = CUR_CHAR(l);
	if (cur == 0) {
	    GROW;
	    SHRINK;
	    cur = CUR_CHAR(l);
	}
        if (len > maxLength) {
            xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "SystemLiteral");
            xmlFree(buf);
            ctxt->instate = (xmlParserInputState) state;
            return(NULL);
        }
    }
    buf[len] = 0;
    ctxt->instate = (xmlParserInputState) state;
    if (!IS_CHAR(cur)) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXT;
    }
    return(buf);
}